

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O0

adjusted_mantissa __thiscall
fast_float::negative_digit_comp<double>
          (fast_float *this,bigint *bigmant,adjusted_mantissa am,int32_t exponent)

{
  undefined1 auVar1 [8];
  undefined4 uVar2;
  adjusted_mantissa *paVar3;
  int iVar4;
  int iVar5;
  uint32_t exp;
  int *piVar6;
  ulong uVar7;
  adjusted_mantissa aVar8;
  int ord;
  uint32_t pow5_exp;
  int32_t pow2_exp;
  int32_t theor_exp;
  bigint theor_digits;
  adjusted_mantissa theor;
  int local_140;
  double b;
  undefined1 local_128 [8];
  adjusted_mantissa am_b;
  int32_t real_exp;
  bigint *real_digits;
  int32_t exponent_local;
  bigint *bigmant_local;
  adjusted_mantissa am_local;
  adjusted_mantissa answer;
  fastfloat_uint word;
  int local_ac;
  int local_a8;
  int local_a4;
  int32_t shift;
  int32_t mantissa_shift;
  anon_class_1_0_00000001 local_91;
  ulong local_90;
  int local_88;
  ulong local_80;
  uint64_t local_78;
  adjusted_mantissa am_1;
  int local_60;
  int local_5c;
  int32_t shift_1;
  int32_t mantissa_shift_1;
  anon_class_4_1_ba1d6a41 local_4c;
  ulong local_48;
  equiv_uint bits;
  undefined8 uStack_38;
  int32_t bias;
  equiv_uint hidden_bit_mask;
  equiv_uint mantissa_mask;
  equiv_uint exponent_mask;
  undefined1 local_18 [8];
  adjusted_mantissa am_2;
  
  am_local.mantissa._0_4_ = (undefined4)am.mantissa;
  am_b._12_4_ = am.power2;
  am_b.mantissa = CONCAT44(am_local.mantissa._4_4_,(undefined4)am_local.mantissa);
  _shift = (adjusted_mantissa *)local_128;
  local_128 = (undefined1  [8])bigmant;
  local_a4 = binary_format<double>::mantissa_explicit_bits();
  paVar3 = _shift;
  local_a4 = 0x3f - local_a4;
  if (-_shift->power2 < local_a4) {
    negative_digit_comp<double>::anon_class_1_0_00000001::operator()(&local_91,_shift,local_a4);
    uVar7 = _shift->mantissa;
    iVar4 = binary_format<double>::mantissa_explicit_bits();
    if ((ulong)(2L << ((byte)iVar4 & 0x3f)) <= uVar7) {
      iVar4 = binary_format<double>::mantissa_explicit_bits();
      _shift->mantissa = 1L << ((byte)iVar4 & 0x3f);
      _shift->power2 = _shift->power2 + 1;
    }
    iVar4 = binary_format<double>::mantissa_explicit_bits();
    _shift->mantissa = (1L << ((byte)iVar4 & 0x3f) ^ 0xffffffffffffffffU) & _shift->mantissa;
    iVar4 = _shift->power2;
    iVar5 = binary_format<double>::infinite_power();
    if (iVar5 <= iVar4) {
      iVar4 = binary_format<double>::infinite_power();
      _shift->power2 = iVar4;
      _shift->mantissa = 0;
    }
  }
  else {
    local_a8 = 1 - _shift->power2;
    local_ac = 0x40;
    piVar6 = std::min<int>(&local_a8,&local_ac);
    negative_digit_comp<double>::anon_class_1_0_00000001::operator()(&local_91,paVar3,*piVar6);
    uVar7 = _shift->mantissa;
    iVar4 = binary_format<double>::mantissa_explicit_bits();
    _shift->power2 = (uint)((ulong)(1L << ((byte)iVar4 & 0x3f)) <= uVar7);
  }
  auVar1 = local_128;
  local_140 = (int)am_b.mantissa;
  iVar4 = binary_format<double>::mantissa_explicit_bits();
  iVar5 = binary_format<double>::sign_index();
  local_80 = 0L << ((byte)iVar5 & 0x3f) | (long)local_140 << ((byte)iVar4 & 0x3f) | (ulong)auVar1;
  mantissa_mask = 0x7ff0000000000000;
  hidden_bit_mask = 0xfffffffffffff;
  uStack_38 = 0x10000000000000;
  exponent_mask = local_80;
  adjusted_mantissa::adjusted_mantissa((adjusted_mantissa *)local_18);
  iVar4 = binary_format<double>::mantissa_explicit_bits();
  iVar5 = binary_format<double>::minimum_exponent();
  bits._4_4_ = iVar4 - iVar5;
  local_48 = exponent_mask;
  if ((exponent_mask & 0x7ff0000000000000) == 0) {
    am_2.mantissa._0_4_ = 1 - bits._4_4_;
    local_18 = (undefined1  [8])(exponent_mask & 0xfffffffffffff);
  }
  else {
    uVar7 = exponent_mask & 0x7ff0000000000000;
    iVar4 = binary_format<double>::mantissa_explicit_bits();
    am_2.mantissa._0_4_ = (int)(uVar7 >> ((byte)iVar4 & 0x3f)) - bits._4_4_;
    local_18 = (undefined1  [8])(local_48 & 0xfffffffffffff | 0x10000000000000);
  }
  local_88 = (int)am_2.mantissa;
  local_90 = (ulong)local_18;
  theor_digits.vec._496_8_ = (long)local_18 * 2 + 1;
  iVar4 = (int)am_2.mantissa + -1;
  local_78 = theor_digits.vec._496_8_;
  am_1.mantissa._0_4_ = iVar4;
  bigint::bigint((bigint *)&pow2_exp,theor_digits.vec._496_8_);
  exp = iVar4 - am_b._12_4_;
  if (-am_b._12_4_ != 0) {
    bigint::pow5((bigint *)&pow2_exp,-am_b._12_4_);
  }
  if ((int)exp < 1) {
    if ((int)exp < 0) {
      bigint::pow2((bigint *)this,-exp);
    }
  }
  else {
    bigint::pow2((bigint *)&pow2_exp,exp);
  }
  local_4c.ord = bigint::compare((bigint *)this,(bigint *)&pow2_exp);
  uVar2 = (undefined4)am_local.mantissa;
  _shift_1 = (adjusted_mantissa *)&am_local.power2;
  am_local._8_8_ = bigmant;
  local_5c = binary_format<double>::mantissa_explicit_bits();
  paVar3 = _shift_1;
  local_5c = 0x3f - local_5c;
  if (-_shift_1->power2 < local_5c) {
    negative_digit_comp<double>::anon_class_4_1_ba1d6a41::operator()(&local_4c,_shift_1,local_5c);
    uVar7 = _shift_1->mantissa;
    iVar4 = binary_format<double>::mantissa_explicit_bits();
    if ((ulong)(2L << ((byte)iVar4 & 0x3f)) <= uVar7) {
      iVar4 = binary_format<double>::mantissa_explicit_bits();
      _shift_1->mantissa = 1L << ((byte)iVar4 & 0x3f);
      _shift_1->power2 = _shift_1->power2 + 1;
    }
    iVar4 = binary_format<double>::mantissa_explicit_bits();
    _shift_1->mantissa = (1L << ((byte)iVar4 & 0x3f) ^ 0xffffffffffffffffU) & _shift_1->mantissa;
    iVar4 = _shift_1->power2;
    iVar5 = binary_format<double>::infinite_power();
    if (iVar5 <= iVar4) {
      iVar4 = binary_format<double>::infinite_power();
      _shift_1->power2 = iVar4;
      _shift_1->mantissa = 0;
    }
  }
  else {
    local_60 = 1 - _shift_1->power2;
    am_1._12_4_ = 0x40;
    piVar6 = std::min<int>(&local_60,(int *)&am_1.field_0xc);
    negative_digit_comp<double>::anon_class_4_1_ba1d6a41::operator()(&local_4c,paVar3,*piVar6);
    uVar7 = _shift_1->mantissa;
    iVar4 = binary_format<double>::mantissa_explicit_bits();
    _shift_1->power2 = (uint)((ulong)(1L << ((byte)iVar4 & 0x3f)) <= uVar7);
  }
  aVar8.power2 = uVar2;
  aVar8.mantissa = am_local._8_8_;
  aVar8._12_4_ = 0;
  return aVar8;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa negative_digit_comp(bigint& bigmant, adjusted_mantissa am, int32_t exponent) noexcept {
  bigint& real_digits = bigmant;
  int32_t real_exp = exponent;

  // get the value of `b`, rounded down, and get a bigint representation of b+h
  adjusted_mantissa am_b = am;
  // gcc7 buf: use a lambda to remove the noexcept qualifier bug with -Wnoexcept-type.
  round<T>(am_b, [](adjusted_mantissa&a, int32_t shift) { round_down(a, shift); });
  T b;
  to_float(false, am_b, b);
  adjusted_mantissa theor = to_extended_halfway(b);
  bigint theor_digits(theor.mantissa);
  int32_t theor_exp = theor.power2;

  // scale real digits and theor digits to be same power.
  int32_t pow2_exp = theor_exp - real_exp;
  uint32_t pow5_exp = uint32_t(-real_exp);
  if (pow5_exp != 0) {
    FASTFLOAT_ASSERT(theor_digits.pow5(pow5_exp));
  }
  if (pow2_exp > 0) {
    FASTFLOAT_ASSERT(theor_digits.pow2(uint32_t(pow2_exp)));
  } else if (pow2_exp < 0) {
    FASTFLOAT_ASSERT(real_digits.pow2(uint32_t(-pow2_exp)));
  }

  // compare digits, and use it to director rounding
  int ord = real_digits.compare(theor_digits);
  adjusted_mantissa answer = am;
  round<T>(answer, [ord](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [ord](bool is_odd, bool _, bool __) -> bool {
      (void)_;  // not needed, since we've done our comparison
      (void)__; // not needed, since we've done our comparison
      if (ord > 0) {
        return true;
      } else if (ord < 0) {
        return false;
      } else {
        return is_odd;
      }
    });
  });

  return answer;
}